

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O0

bool __thiscall LinkedObjectFile::label_points_to_code(LinkedObjectFile *this,int label_id)

{
  const_reference pvVar1;
  const_reference pvVar2;
  size_type in_RDI;
  int data_start;
  value_type *label;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  pvVar1 = std::vector<Label,_std::allocator<Label>_>::at
                     ((vector<Label,_std::allocator<Label>_> *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
  return pvVar1->offset < (int)(*pvVar2 << 2);
}

Assistant:

bool LinkedObjectFile::label_points_to_code(int label_id) const {
  auto& label = labels.at(label_id);
  auto data_start = int(offset_of_data_zone_by_seg.at(label.target_segment)) * 4;
  return label.offset < data_start;
}